

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
          (BinaryWriterSpec *this,Stream *json_stream,
          WriteBinarySpecStreamFactory *module_stream_factory,string_view source_filename,
          string_view module_filename_noext,WriteBinaryOptions *options)

{
  allocator<char> local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = source_filename._M_str;
  local_28._M_len = source_filename._M_len;
  this->script_ = (Script *)0x0;
  this->json_stream_ = json_stream;
  std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::function
            (&this->module_stream_factory_,module_stream_factory);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->source_filename_,&local_28,&local_29);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->module_filename_noext_,&module_filename_noext,&local_29);
  this->options_ = options;
  (this->result_).enum_ = Ok;
  this->num_modules_ = 0;
  return;
}

Assistant:

BinaryWriterSpec::BinaryWriterSpec(
    Stream* json_stream,
    WriteBinarySpecStreamFactory module_stream_factory,
    std::string_view source_filename,
    std::string_view module_filename_noext,
    const WriteBinaryOptions& options)
    : json_stream_(json_stream),
      module_stream_factory_(module_stream_factory),
      source_filename_(source_filename),
      module_filename_noext_(module_filename_noext),
      options_(options) {}